

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

bool Cipher::doSimulatedAnnealing5
               (TParameters *params,TFreqMap *freqMap,TSimilarityMap *ccMap,TClusters *clusters,
               TClusterToLetterMap *clMap)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  const_reference this;
  const_reference pvVar10;
  const_reference pvVar11;
  mapped_type_conflict *pmVar12;
  mapped_type *pmVar13;
  uint *puVar14;
  rep rVar15;
  reference pvVar16;
  mapped_type *__b;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDX;
  long in_RDI;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  TProb TVar22;
  double dVar23;
  float delta_1;
  float cost1_1;
  int letterNew;
  float delta;
  float cost1;
  float costCurLM;
  float costCurCL;
  int i3;
  int i2;
  int i1;
  int i_3;
  int i1l;
  int cid;
  int i_4;
  float iterPerT;
  time_point tEnd;
  int iter;
  time_point tStart;
  float costOld;
  int nRepeat;
  float cost0;
  float cost0LM;
  float cost0CL;
  float temp;
  float wlm;
  int i_2;
  int ii;
  int i_1;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> used;
  int i;
  int j;
  float ccavg;
  int ncc;
  int n;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffd98;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  float fVar24;
  TSimilarityMap *in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdbc;
  TSimilarityMap *in_stack_fffffffffffffdc0;
  mapped_type *in_stack_fffffffffffffdd8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffde0;
  byte local_1ed;
  int local_138;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_100;
  float local_f4;
  undefined8 local_f0;
  uint local_e4;
  undefined8 local_e0;
  float local_d8;
  int local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  int local_bc;
  int local_b8;
  int local_a4;
  int local_3c;
  int local_38;
  float local_34;
  int local_30;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_20;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *local_18;
  long local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar9 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  local_2c = (int)sVar9;
  local_30 = 0;
  local_34 = 0.0;
  for (local_38 = 0; iVar4 = local_38, local_38 < local_2c; local_38 = local_38 + 1) {
    while (local_3c = iVar4 + 1, local_3c < local_2c) {
      this = std::
             vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             ::operator[](local_18,(long)local_38);
      pvVar10 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](this,(long)local_3c);
      local_34 = (float)((double)local_34 + pvVar10->cc);
      local_30 = local_30 + 1;
      iVar4 = local_3c;
    }
  }
  local_34 = local_34 / (float)local_30;
  printf("Average cc = %g\n",(double)local_34);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1aaaa4)
  ;
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1aaab1);
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1aaabe);
  for (local_a4 = 0; iVar4 = local_a4,
      sVar9 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_8 + 0x60)), iVar4 < (int)sVar9;
      local_a4 = local_a4 + 1) {
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(local_8 + 0x60),(long)local_a4);
    if (-1 < *pvVar11) {
      std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_a4);
      pmVar12 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                            *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if ((*pmVar12 & 1U) == 0) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(local_8 + 0x60),(long)local_a4);
        vVar1 = *pvVar11;
        std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_a4);
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        *pmVar13 = vVar1;
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(local_8 + 0x60),(long)local_a4);
        pmVar12 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                  ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        *pmVar12 = true;
        std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_a4);
        pmVar12 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                  ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        *pmVar12 = true;
        puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (local_20,(long)local_a4);
        printf("Fixed %d\n",(ulong)*puVar14);
      }
    }
  }
  local_b8 = 0;
  for (local_bc = 0; local_bc < *(int *)(local_8 + 4); local_bc = local_bc + 1) {
    pmVar12 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
              operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                          *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    if ((*pmVar12 & 1U) == 0) {
      while (pmVar12 = std::
                       map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                     *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
            iVar4 = local_b8, (*pmVar12 & 1U) != 0) {
        local_b8 = local_b8 + 1;
      }
      local_b8 = local_b8 + 1;
      pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      *pmVar13 = iVar4;
    }
  }
  local_c0 = *(float *)(local_8 + 0x38);
  local_c4 = *(float *)(local_8 + 0x14);
  local_c8 = costF(in_stack_fffffffffffffdb0,
                   (TClusters *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  TVar22 = calcScore0((TParameters *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (TFreqMap *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (TClusters *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                      (TClusterToLetterMap *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_cc = (float)TVar22;
  local_d8 = local_c0 * local_cc + local_c8;
  local_d4 = 0;
  local_d0 = local_d8;
  local_e0 = std::chrono::_V2::system_clock::now();
  for (local_e4 = 0; (int)local_e4 < *(int *)(local_8 + 0x10); local_e4 = local_e4 + 1) {
    if ((int)local_e4 % 10000 == 0) {
      local_f0 = std::chrono::_V2::system_clock::now();
      fVar17 = (float)(int)local_e4;
      std::chrono::operator-
                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffda0);
      local_100.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (in_stack_fffffffffffffd98);
      rVar15 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_100);
      local_f4 = fVar17 / (float)rVar15;
      printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n"
             ,(double)local_f4,(double)local_c4,(double)local_d0,(double)local_c8,(double)local_cc,
             (ulong)local_e4);
      for (local_10c = 0; sVar9 = std::vector<int,_std::allocator<int>_>::size(local_20),
          local_10c < (int)sVar9; local_10c = local_10c + 1) {
        std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_10c);
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        printf("%c",(ulong)(*pmVar13 + 0x60));
      }
      printf("\n");
    }
    if ((local_d8 != local_d0) || (NAN(local_d8) || NAN(local_d0))) {
      local_d4 = 0;
      local_d8 = local_d0;
    }
    else {
      local_d4 = local_d4 + 1;
      dVar23 = (double)*(int *)(local_8 + 0x10) * 0.01;
      if (((double)local_d4 == dVar23) && (!NAN((double)local_d4) && !NAN(dVar23))) {
        printf("No improvement for long time. Aborting\n");
        local_e4 = *(int *)(local_8 + 0x10) + 1;
      }
    }
    iVar4 = rand();
    iVar4 = iVar4 % local_2c;
    iVar5 = rand();
    iVar5 = iVar5 % *(int *)(local_8 + 4);
    iVar6 = rand();
    iVar6 = iVar6 % *(int *)(local_8 + 4);
    iVar7 = rand();
    iVar7 = iVar7 % *(int *)(local_8 + 4);
    fVar17 = local_cc;
    while (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_8 + 0x60),(long)iVar4),
          -1 < *pvVar11) {
      iVar4 = rand();
      iVar4 = iVar4 % local_2c;
    }
    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)iVar4);
    iVar2 = *pvVar16;
    while (pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)iVar4),
          iVar2 == *pvVar16) {
      iVar8 = rand();
      iVar3 = *(int *)(local_8 + 4);
      pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)iVar4);
      *pvVar16 = iVar8 % iVar3;
    }
    fVar18 = costFUpdate(in_stack_fffffffffffffdc0,
                         (TClusters *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                         (int)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    fVar19 = local_c0 * local_cc + fVar18;
    fVar24 = fVar19;
    fVar21 = fVar18;
    if (fVar19 - local_d0 <= 0.0) {
      dVar23 = std::exp((double)(ulong)(uint)(((fVar19 - local_d0) / local_c4) * 0.01));
      fVar20 = frand();
      fVar24 = fVar19;
      fVar21 = fVar18;
      if (SUB84(dVar23,0) <= fVar20) {
        pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)iVar4);
        *pvVar16 = iVar2;
        fVar24 = local_d0;
        fVar21 = local_c8;
      }
    }
    while( true ) {
      local_c8 = fVar21;
      local_d0 = fVar24;
      local_1ed = 1;
      if (iVar6 != iVar7) {
        pmVar12 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                  ::operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        local_1ed = 1;
        if ((*pmVar12 & 1U) == 0) {
          pmVar12 = std::
                    map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                    operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          local_1ed = *pmVar12;
        }
      }
      if ((local_1ed & 1) == 0) break;
      iVar6 = rand();
      iVar6 = iVar6 % *(int *)(local_8 + 4);
      iVar7 = rand();
      iVar7 = iVar7 % *(int *)(local_8 + 4);
      fVar24 = local_d0;
      fVar21 = local_c8;
    }
    pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    __b = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
          operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::swap<int>(pmVar13,__b);
    while (pmVar12 = std::
                     map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                     operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                                 *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8),
          (*pmVar12 & 1U) != 0) {
      iVar5 = rand();
      iVar5 = iVar5 % *(int *)(local_8 + 4);
    }
    in_stack_fffffffffffffde0 =
         (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    fVar24 = *(float *)&(in_stack_fffffffffffffde0->_M_t)._M_impl;
    local_138 = rand();
    while( true ) {
      local_138 = local_138 % 0x1b;
      in_stack_fffffffffffffdd8 =
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if (*in_stack_fffffffffffffdd8 != local_138) break;
      local_138 = rand();
    }
    pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    *pmVar13 = local_138;
    in_stack_fffffffffffffdc0 =
         (TSimilarityMap *)
         calcScore0((TParameters *)CONCAT44(fVar24,iVar4),(TFreqMap *)CONCAT44(iVar5,iVar6),
                    (TClusters *)CONCAT44(iVar7,fVar18),
                    (TClusterToLetterMap *)CONCAT44(fVar17,fVar19));
    fVar21 = (float)(double)in_stack_fffffffffffffdc0;
    fVar17 = local_c0 * fVar21 + local_c8;
    if (fVar17 - local_d0 <= 0.0) {
      dVar23 = std::exp((double)(ulong)(uint)(((fVar17 - local_d0) / local_c4) * 0.01));
      in_stack_fffffffffffffdbc = SUB84(dVar23,0);
      in_stack_fffffffffffffdb8 = frand();
      if (in_stack_fffffffffffffdbc <= in_stack_fffffffffffffdb8) {
        in_stack_fffffffffffffdb0 =
             (TSimilarityMap *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        *(float *)&(in_stack_fffffffffffffdb0->
                   super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start = fVar24;
        in_stack_fffffffffffffda0 =
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffd98 =
             (duration<long,_std::ratio<1L,_1000000000L>_> *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        std::swap<int>((int *)in_stack_fffffffffffffda0,(int *)in_stack_fffffffffffffd98);
        in_stack_fffffffffffffdac = fVar24;
        fVar17 = local_d0;
        fVar21 = local_cc;
      }
    }
    local_cc = fVar21;
    local_d0 = fVar17;
    local_c4 = *(float *)(local_8 + 0x18) * local_c4;
  }
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1ab752);
  std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::~map
            ((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *)
             0x1ab75f);
  return true;
}

Assistant:

bool doSimulatedAnnealing5(
        const TParameters & params,
        const TFreqMap & freqMap,
        const TSimilarityMap & ccMap,
        TClusters & clusters,
        TClusterToLetterMap & clMap
        ) {

        int n = clusters.size();

        int ncc = 0;
        float ccavg = 0.0;
        for (int j = 0; j < n; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccavg += ccMap[j][i].cc;
                ++ncc;
            }
        }
        ccavg /= ncc;
        printf("Average cc = %g\n", ccavg);

        clMap.clear();
        std::map<TLetter, bool> used;
        std::map<TClusterId, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            //if (used[params.hint[i]]) continue;
            if (fixed[clusters[i]]) continue;

            clMap[clusters[i]] = params.hint[i];
            used[params.hint[i]] = true;
            fixed[clusters[i]] = true;
            printf("Fixed %d\n", clusters[i]);
        }

        {
            int ii = 0;
            for (int i = 0; i < params.maxClusters; ++i) {
                if (fixed[i]) continue;
                while (used[ii]) ++ii;
                clMap[i] = ii++;
            }
        }

        float wlm = params.wLanguageModel;
        float temp = params.temp0;
        float cost0CL = costF(ccMap, clusters);
        float cost0LM = calcScore0(params, freqMap, clusters, clMap);
        float cost0 = cost0CL + wlm*cost0LM;

        int nRepeat = 0;
        float costOld = cost0;

        auto tStart = std::chrono::high_resolution_clock::now();

        for (int iter = 0; iter < params.saMaxIterations; ++iter) {
            if (iter%10000 == 0) {
                auto tEnd = std::chrono::high_resolution_clock::now();
                float iterPerT = (float)(iter)/((float)(std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count()));

                printf("Speed: %6.2f iter/ms, Iter %5d : temp = %16.4f, cost0 = %8.4f, costCL = %8.4f, costLM = %8.4f\n",
                       iterPerT, iter, temp, cost0, cost0CL, cost0LM);
                for (int i = 0; i < (int) clusters.size(); ++i) { printf("%c", 'a'+clMap[clusters[i]]-1); }
                printf("\n");
            }

            if (costOld == cost0) {
                //if (++nRepeat == 0.005*params.saMaxIterations) {
                //    printf("Heating\n");
                //    temp *= 100.1f;
                //}
                if (++nRepeat == 0.01*params.saMaxIterations) {
                    printf("No improvement for long time. Aborting\n");
                    iter = params.saMaxIterations + 1;
                }
            } else {
                nRepeat = 0;
                costOld = cost0;
            }

            int cid = -1;
            int i1l = -1;
            int i = rand()%n;
            int i1 = rand()%params.maxClusters;
            int i2 = rand()%params.maxClusters;
            int i3 = rand()%params.maxClusters;

            float costCurCL = cost0CL;
            float costCurLM = cost0LM;

            {
                while (params.hint[i] >= 0) {
                    i = rand()%n;
                }

                cid = clusters[i];
                while (cid == clusters[i]) {
                    clusters[i] = rand()%params.maxClusters;
                }

                costCurCL = costFUpdate(ccMap, clusters, i, cid, cost0CL);

                float cost1 = costCurCL + wlm*cost0LM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0CL = costCurCL;
                    cost0 = cost1;
                } else {
                    clusters[i] = cid;
                }
            }

            {
                while (i2 == i3 || fixed[i2] || fixed[i3]) {
                    i2 = rand()%params.maxClusters;
                    i3 = rand()%params.maxClusters;
                }
                std::swap(clMap[i2], clMap[i3]);

                while (fixed[i1]) {
                    i1 = rand()%params.maxClusters;
                }
                i1l = clMap[i1];
                int letterNew = rand()%27;
                while (clMap[i1] == letterNew) {
                    letterNew = rand()%27;
                }

                clMap[i1] = letterNew;

                costCurLM = calcScore0(params, freqMap, clusters, clMap);

                float cost1 = cost0CL + wlm*costCurLM;
                float delta = cost1 - cost0;
                if (delta > 0 || (std::exp(0.01f*(delta/temp)) > frand())) {
                    cost0LM = costCurLM;
                    cost0 = cost1;
                } else {
                    clMap[i1] = i1l;
                    std::swap(clMap[i2], clMap[i3]);
                }
            }

            temp *= params.coolingRate;
        }

        return true;
    }